

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

uint64_t * shuff_med3(uint64_t *a,uint64_t *b,uint64_t *c,uint64_t *freq)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  
  uVar1 = freq[*a];
  uVar2 = freq[*c];
  lVar3 = freq[*b] - uVar2;
  if ((long)(uVar1 - freq[*b]) < 0) {
    if (-1 < lVar3) {
      if ((long)(uVar1 - uVar2) < 0) {
        a = c;
      }
      return a;
    }
  }
  else if (lVar3 < 1) {
    if ((long)(uVar1 - uVar2) < 0) {
      c = a;
    }
    return c;
  }
  return b;
}

Assistant:

uint64_t* shuff_med3(uint64_t* a, uint64_t* b, uint64_t* c, uint64_t freq[])
{
    return shuff_cmp(a, b, freq) < 0
        ? (shuff_cmp(b, c, freq) < 0 ? b : (shuff_cmp(a, c, freq) < 0 ? c : a))
        : (shuff_cmp(b, c, freq) > 0 ? b : (shuff_cmp(a, c, freq) < 0 ? a : c));
}